

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_memory.cpp
# Opt level: O1

bool spvtools::val::anon_unknown_2::ContainsCooperativeMatrix
               (ValidationState_t *_,Instruction *storage)

{
  ushort uVar1;
  bool bVar2;
  uint uVar3;
  Instruction *storage_00;
  size_t index;
  
  bVar2 = false;
  while (uVar1 = (storage->inst_).opcode, uVar1 - 0x1c < 2) {
    uVar3 = Instruction::GetOperandAs<unsigned_int>(storage,1);
    storage = ValidationState_t::FindDef(_,uVar3);
  }
  if ((uVar1 == 0x14ee) || (uVar1 == 0x1168)) {
LAB_001e92be:
    bVar2 = true;
  }
  else if (uVar1 == 0x1e) {
    if (0x10 < (ulong)((long)(storage->operands_).
                             super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(storage->operands_).
                            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                            ._M_impl.super__Vector_impl_data._M_start)) {
      index = 1;
      do {
        uVar3 = Instruction::GetOperandAs<unsigned_int>(storage,index);
        storage_00 = ValidationState_t::FindDef(_,uVar3);
        bVar2 = ContainsCooperativeMatrix(_,storage_00);
        if (bVar2) goto LAB_001e92be;
        index = index + 1;
      } while (index < (ulong)((long)(storage->operands_).
                                     super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(storage->operands_).
                                     super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 4));
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool ContainsCooperativeMatrix(ValidationState_t& _,
                               const Instruction* storage) {
  const size_t elem_type_index = 1;
  uint32_t elem_type_id;
  Instruction* elem_type;

  switch (storage->opcode()) {
    case spv::Op::OpTypeCooperativeMatrixNV:
    case spv::Op::OpTypeCooperativeMatrixKHR:
      return true;
    case spv::Op::OpTypeArray:
    case spv::Op::OpTypeRuntimeArray:
      elem_type_id = storage->GetOperandAs<uint32_t>(elem_type_index);
      elem_type = _.FindDef(elem_type_id);
      return ContainsCooperativeMatrix(_, elem_type);
    case spv::Op::OpTypeStruct:
      for (size_t member_type_index = 1;
           member_type_index < storage->operands().size();
           ++member_type_index) {
        auto member_type_id =
            storage->GetOperandAs<uint32_t>(member_type_index);
        auto member_type = _.FindDef(member_type_id);
        if (ContainsCooperativeMatrix(_, member_type)) return true;
      }
      break;
    default:
      break;
  }
  return false;
}